

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

Light_EvalRes * embree::Light_eval(Light *uniform,DifferentialGeometry *param_2,Vec3fa *param_3)

{
  Light_EvalRes *res;
  Light_EvalRes *in_RDI;
  
  *(undefined8 *)&(in_RDI->value).field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
  in_RDI->dist = INFINITY;
  in_RDI->pdf = 0.0;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes Light_eval(const Light* uniform,
                                                      const DifferentialGeometry&,
                                                      const Vec3fa&)
{
  Light_EvalRes res;
  res.value = Vec3fa(0.f);
  res.dist = inf;
  res.pdf = 0.f;
  return res;
}